

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglChooseConfigTests.cpp
# Opt level: O1

int __thiscall deqp::egl::ChooseConfigTests::init(ChooseConfigTests *this,EVP_PKEY_CTX *ctx)

{
  undefined4 uVar1;
  char *name;
  EglTestContext *pEVar2;
  int extraout_EAX;
  TestNode *pTVar3;
  TestNode *pTVar4;
  TestCase *pTVar5;
  ChooseConfigRandomCase *pCVar6;
  uint (*arr) [2];
  uint (*arr_00) [2];
  long lVar7;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> set;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_70;
  TestNode *local_40;
  TestNode *local_38;
  
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"simple",
             "Simple tests");
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  pTVar4 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "selection_only","Selection tests, order ignored");
  local_38 = pTVar4;
  tcu::TestNode::addChild(pTVar3,pTVar4);
  pTVar4 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "selection_and_sort","Selection and ordering tests");
  tcu::TestNode::addChild(pTVar3,pTVar4);
  lVar7 = 8;
  local_40 = pTVar4;
  do {
    pTVar5 = (TestCase *)operator_new(0xa8);
    name = *(char **)((long)&init::attributes[0].attribute + lVar7);
    uVar1 = *(undefined4 *)(&UNK_02162288 + lVar7);
    TestCase::TestCase(pTVar5,(this->super_TestCaseGroup).m_eglTestCtx,name,
                       "Simple config selection case");
    *(undefined1 *)&pTVar5[1].super_TestCase.super_TestNode._vptr_TestNode = 0;
    pTVar5[1].super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x0;
    pTVar5[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p = (pointer)0x0;
    pTVar5[1].super_TestCase.super_TestNode.m_name._M_string_length = 0;
    pTVar5[1].super_TestCase.super_TestNode.m_name.field_2._M_allocated_capacity = 0;
    (pTVar5->super_TestCase).super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ChooseConfigCase_02162478;
    *(undefined4 *)((long)&pTVar5[1].super_TestCase.super_TestNode.m_name.field_2 + 8) = uVar1;
    tcu::TestNode::addChild(local_38,(TestNode *)pTVar5);
    pTVar5 = (TestCase *)operator_new(0xa8);
    TestCase::TestCase(pTVar5,(this->super_TestCaseGroup).m_eglTestCtx,name,
                       "Simple config selection and sort case");
    *(undefined1 *)&pTVar5[1].super_TestCase.super_TestNode._vptr_TestNode = 1;
    pTVar5[1].super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x0;
    pTVar5[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p = (pointer)0x0;
    pTVar5[1].super_TestCase.super_TestNode.m_name._M_string_length = 0;
    pTVar5[1].super_TestCase.super_TestNode.m_name.field_2._M_allocated_capacity = 0;
    (pTVar5->super_TestCase).super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ChooseConfigCase_02162478;
    *(undefined4 *)((long)&pTVar5[1].super_TestCase.super_TestNode.m_name.field_2 + 8) = uVar1;
    tcu::TestNode::addChild(local_40,(TestNode *)pTVar5);
    lVar7 = lVar7 + 0x10;
  } while (lVar7 != 0x1c8);
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"random",
             "Random eglChooseConfig() usage");
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  pCVar6 = (ChooseConfigRandomCase *)operator_new(0xd8);
  pEVar2 = (this->super_TestCaseGroup).m_eglTestCtx;
  local_70._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_70._M_impl.super__Rb_tree_header._M_header;
  local_70._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  lVar7 = 0;
  local_70._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_70._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_70._M_impl.super__Rb_tree_header._M_header._M_right =
       local_70._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    std::
    _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
    ::_M_insert_unique<unsigned_int_const&>
              ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                *)&local_70,(uint *)((long)init::rgbaSizes + lVar7));
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x10);
  ChooseConfigRandomCase::ChooseConfigRandomCase
            (pCVar6,pEVar2,"color_sizes","Random color size rules",
             (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)&local_70)
  ;
  tcu::TestNode::addChild(pTVar3,(TestNode *)pCVar6);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree(&local_70);
  pCVar6 = (ChooseConfigRandomCase *)operator_new(0xd8);
  pEVar2 = (this->super_TestCaseGroup).m_eglTestCtx;
  local_70._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  lVar7 = 0;
  local_70._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_70._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_70._M_impl.super__Rb_tree_header._M_header;
  local_70._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_70._M_impl.super__Rb_tree_header._M_header._M_right =
       local_70._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    std::
    _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
    ::_M_insert_unique<unsigned_int_const&>
              ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                *)&local_70,(uint *)((long)init::colorDepthStencilSizes + lVar7));
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x18);
  ChooseConfigRandomCase::ChooseConfigRandomCase
            (pCVar6,pEVar2,"color_depth_stencil_sizes","Random color, depth and stencil size rules",
             (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)&local_70)
  ;
  tcu::TestNode::addChild(pTVar3,(TestNode *)pCVar6);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree(&local_70);
  pCVar6 = (ChooseConfigRandomCase *)operator_new(0xd8);
  pEVar2 = (this->super_TestCaseGroup).m_eglTestCtx;
  local_70._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  lVar7 = 0;
  local_70._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_70._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_70._M_impl.super__Rb_tree_header._M_header;
  local_70._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_70._M_impl.super__Rb_tree_header._M_header._M_right =
       local_70._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    std::
    _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
    ::_M_insert_unique<unsigned_int_const&>
              ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                *)&local_70,(uint *)((long)init::bufferSizes + lVar7));
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x14);
  ChooseConfigRandomCase::ChooseConfigRandomCase
            (pCVar6,pEVar2,"buffer_sizes","Various buffer size rules",
             (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)&local_70)
  ;
  tcu::TestNode::addChild(pTVar3,(TestNode *)pCVar6);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree(&local_70);
  pCVar6 = (ChooseConfigRandomCase *)operator_new(0xd8);
  pEVar2 = (this->super_TestCaseGroup).m_eglTestCtx;
  egl::(anonymous_namespace)::toSet<unsigned_int,2ul>
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)&local_70,
             (_anonymous_namespace_ *)init::surfaceType,arr);
  ChooseConfigRandomCase::ChooseConfigRandomCase
            (pCVar6,pEVar2,"surface_type","Surface type rules",
             (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)&local_70)
  ;
  tcu::TestNode::addChild(pTVar3,(TestNode *)pCVar6);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree(&local_70);
  pCVar6 = (ChooseConfigRandomCase *)operator_new(0xd8);
  pEVar2 = (this->super_TestCaseGroup).m_eglTestCtx;
  egl::(anonymous_namespace)::toSet<unsigned_int,2ul>
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)&local_70,
             (_anonymous_namespace_ *)init::sampleBuffers,arr_00);
  ChooseConfigRandomCase::ChooseConfigRandomCase
            (pCVar6,pEVar2,"sample_buffers","Sample buffer rules",
             (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)&local_70)
  ;
  tcu::TestNode::addChild(pTVar3,(TestNode *)pCVar6);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree(&local_70);
  pCVar6 = (ChooseConfigRandomCase *)operator_new(0xd8);
  pEVar2 = (this->super_TestCaseGroup).m_eglTestCtx;
  local_70._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  lVar7 = 0;
  local_70._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_70._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_70._M_impl.super__Rb_tree_header._M_header;
  local_70._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_70._M_impl.super__Rb_tree_header._M_header._M_right =
       local_70._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    std::
    _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
    ::_M_insert_unique<unsigned_int_const&>
              ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                *)&local_70,(uint *)((long)init::allAttribs + lVar7));
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x60);
  ChooseConfigRandomCase::ChooseConfigRandomCase
            (pCVar6,pEVar2,"all","All attributes",
             (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)&local_70)
  ;
  tcu::TestNode::addChild(pTVar3,(TestNode *)pCVar6);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree(&local_70);
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "color_component_type_ext","EGL_EXT_pixel_format_float tests");
  pTVar5 = (TestCase *)operator_new(0xa8);
  TestCase::TestCase(pTVar5,(this->super_TestCaseGroup).m_eglTestCtx,"dont_care",
                     glcts::fixed_sample_locations_values + 1);
  *(undefined1 *)&pTVar5[1].super_TestCase.super_TestNode._vptr_TestNode = 1;
  pTVar5[1].super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x0;
  pTVar5[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p = (pointer)0x0;
  pTVar5[1].super_TestCase.super_TestNode.m_name._M_string_length = 0;
  pTVar5[1].super_TestCase.super_TestNode.m_name.field_2._M_allocated_capacity = 0;
  (pTVar5->super_TestCase).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ChooseConfigCase_021626d0;
  *(undefined4 *)((long)&pTVar5[1].super_TestCase.super_TestNode.m_name.field_2 + 8) = 0xffffffff;
  tcu::TestNode::addChild(pTVar3,(TestNode *)pTVar5);
  pTVar5 = (TestCase *)operator_new(0xa8);
  TestCase::TestCase(pTVar5,(this->super_TestCaseGroup).m_eglTestCtx,"fixed",
                     glcts::fixed_sample_locations_values + 1);
  *(undefined1 *)&pTVar5[1].super_TestCase.super_TestNode._vptr_TestNode = 1;
  pTVar5[1].super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x0;
  pTVar5[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p = (pointer)0x0;
  pTVar5[1].super_TestCase.super_TestNode.m_name._M_string_length = 0;
  pTVar5[1].super_TestCase.super_TestNode.m_name.field_2._M_allocated_capacity = 0;
  (pTVar5->super_TestCase).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ChooseConfigCase_021626d0;
  *(undefined4 *)((long)&pTVar5[1].super_TestCase.super_TestNode.m_name.field_2 + 8) = 0x333a;
  tcu::TestNode::addChild(pTVar3,(TestNode *)pTVar5);
  pTVar5 = (TestCase *)operator_new(0xa8);
  TestCase::TestCase(pTVar5,(this->super_TestCaseGroup).m_eglTestCtx,"float",
                     glcts::fixed_sample_locations_values + 1);
  *(undefined1 *)&pTVar5[1].super_TestCase.super_TestNode._vptr_TestNode = 1;
  pTVar5[1].super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x0;
  pTVar5[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p = (pointer)0x0;
  pTVar5[1].super_TestCase.super_TestNode.m_name._M_string_length = 0;
  pTVar5[1].super_TestCase.super_TestNode.m_name.field_2._M_allocated_capacity = 0;
  (pTVar5->super_TestCase).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ChooseConfigCase_021626d0;
  *(undefined4 *)((long)&pTVar5[1].super_TestCase.super_TestNode.m_name.field_2 + 8) = 0x333b;
  tcu::TestNode::addChild(pTVar3,(TestNode *)pTVar5);
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  return extraout_EAX;
}

Assistant:

void ChooseConfigTests::init (void)
{
	// Single attributes
	{
		static const struct
		{
			EGLenum			attribute;
			const char*		testName;
		} attributes[] =
		{
			{ EGL_BUFFER_SIZE,				"buffer_size"				},
			{ EGL_RED_SIZE,					"red_size"					},
			{ EGL_GREEN_SIZE,				"green_size"				},
			{ EGL_BLUE_SIZE,				"blue_size"					},
			{ EGL_LUMINANCE_SIZE,			"luminance_size"			},
			{ EGL_ALPHA_SIZE,				"alpha_size"				},
			{ EGL_ALPHA_MASK_SIZE,			"alpha_mask_size"			},
			{ EGL_BIND_TO_TEXTURE_RGB,		"bind_to_texture_rgb"		},
			{ EGL_BIND_TO_TEXTURE_RGBA,		"bind_to_texture_rgba"		},
			{ EGL_COLOR_BUFFER_TYPE,		"color_buffer_type"			},
			{ EGL_CONFIG_CAVEAT,			"config_caveat"				},
			{ EGL_CONFIG_ID,				"config_id"					},
			{ EGL_CONFORMANT,				"conformant"				},
			{ EGL_DEPTH_SIZE,				"depth_size"				},
			{ EGL_LEVEL,					"level"						},
			{ EGL_MAX_SWAP_INTERVAL,		"max_swap_interval"			},
			{ EGL_MIN_SWAP_INTERVAL,		"min_swap_interval"			},
			{ EGL_NATIVE_RENDERABLE,		"native_renderable"			},
			{ EGL_NATIVE_VISUAL_TYPE,		"native_visual_type"		},
			{ EGL_RENDERABLE_TYPE,			"renderable_type"			},
			{ EGL_SAMPLE_BUFFERS,			"sample_buffers"			},
			{ EGL_SAMPLES,					"samples"					},
			{ EGL_STENCIL_SIZE,				"stencil_size"				},
			{ EGL_SURFACE_TYPE,				"surface_type"				},
			{ EGL_TRANSPARENT_TYPE,			"transparent_type"			},
			{ EGL_TRANSPARENT_RED_VALUE,	"transparent_red_value"		},
			{ EGL_TRANSPARENT_GREEN_VALUE,	"transparent_green_value"	},
			{ EGL_TRANSPARENT_BLUE_VALUE,	"transparent_blue_value"	}
		};

		tcu::TestCaseGroup* simpleGroup = new tcu::TestCaseGroup(m_testCtx, "simple", "Simple tests");
		addChild(simpleGroup);

		tcu::TestCaseGroup* selectionGroup = new tcu::TestCaseGroup(m_testCtx, "selection_only", "Selection tests, order ignored");
		simpleGroup->addChild(selectionGroup);

		tcu::TestCaseGroup* sortGroup = new tcu::TestCaseGroup(m_testCtx, "selection_and_sort", "Selection and ordering tests");
		simpleGroup->addChild(sortGroup);

		for (int ndx = 0; ndx < (int)DE_LENGTH_OF_ARRAY(attributes); ndx++)
		{
			selectionGroup->addChild(new ChooseConfigSimpleCase(m_eglTestCtx, attributes[ndx].testName, "Simple config selection case", attributes[ndx].attribute, false));
			sortGroup->addChild(new ChooseConfigSimpleCase(m_eglTestCtx, attributes[ndx].testName, "Simple config selection and sort case", attributes[ndx].attribute, true));
		}
	}

	// Random
	{
		tcu::TestCaseGroup* randomGroup = new tcu::TestCaseGroup(m_testCtx, "random", "Random eglChooseConfig() usage");
		addChild(randomGroup);

		static const EGLenum rgbaSizes[] =
		{
			EGL_RED_SIZE,
			EGL_GREEN_SIZE,
			EGL_BLUE_SIZE,
			EGL_ALPHA_SIZE
		};
		randomGroup->addChild(new ChooseConfigRandomCase(m_eglTestCtx, "color_sizes", "Random color size rules", toSet(rgbaSizes)));

		static const EGLenum colorDepthStencilSizes[] =
		{
			EGL_RED_SIZE,
			EGL_GREEN_SIZE,
			EGL_BLUE_SIZE,
			EGL_ALPHA_SIZE,
			EGL_DEPTH_SIZE,
			EGL_STENCIL_SIZE
		};
		randomGroup->addChild(new ChooseConfigRandomCase(m_eglTestCtx, "color_depth_stencil_sizes", "Random color, depth and stencil size rules", toSet(colorDepthStencilSizes)));

		static const EGLenum bufferSizes[] =
		{
			EGL_BUFFER_SIZE,
			EGL_LUMINANCE_SIZE,
			EGL_ALPHA_MASK_SIZE,
			EGL_DEPTH_SIZE,
			EGL_STENCIL_SIZE
		};
		randomGroup->addChild(new ChooseConfigRandomCase(m_eglTestCtx, "buffer_sizes", "Various buffer size rules", toSet(bufferSizes)));

		static const EGLenum surfaceType[] =
		{
			EGL_NATIVE_RENDERABLE,
			EGL_SURFACE_TYPE
		};
		randomGroup->addChild(new ChooseConfigRandomCase(m_eglTestCtx, "surface_type", "Surface type rules", toSet(surfaceType)));

		static const EGLenum sampleBuffers[] =
		{
			EGL_SAMPLE_BUFFERS,
			EGL_SAMPLES
		};
		randomGroup->addChild(new ChooseConfigRandomCase(m_eglTestCtx, "sample_buffers", "Sample buffer rules", toSet(sampleBuffers)));

		// \note Not every attribute is supported at the moment
		static const EGLenum allAttribs[] =
		{
			EGL_BUFFER_SIZE,
			EGL_RED_SIZE,
			EGL_GREEN_SIZE,
			EGL_BLUE_SIZE,
			EGL_ALPHA_SIZE,
			EGL_ALPHA_MASK_SIZE,
			EGL_BIND_TO_TEXTURE_RGB,
			EGL_BIND_TO_TEXTURE_RGBA,
			EGL_COLOR_BUFFER_TYPE,
			EGL_CONFIG_CAVEAT,
			EGL_CONFIG_ID,
			EGL_CONFORMANT,
			EGL_DEPTH_SIZE,
			EGL_LEVEL,
//			EGL_MATCH_NATIVE_PIXMAP,
			EGL_MAX_SWAP_INTERVAL,
			EGL_MIN_SWAP_INTERVAL,
			EGL_NATIVE_RENDERABLE,
			EGL_NATIVE_VISUAL_TYPE,
			EGL_RENDERABLE_TYPE,
			EGL_SAMPLE_BUFFERS,
			EGL_SAMPLES,
			EGL_STENCIL_SIZE,
			EGL_SURFACE_TYPE,
			EGL_TRANSPARENT_TYPE,
//			EGL_TRANSPARENT_RED_VALUE,
//			EGL_TRANSPARENT_GREEN_VALUE,
//			EGL_TRANSPARENT_BLUE_VALUE
		};
		randomGroup->addChild(new ChooseConfigRandomCase(m_eglTestCtx, "all", "All attributes", toSet(allAttribs)));
	}

	// EGL_EXT_pixel_format_float
	{
		de::MovePtr<tcu::TestCaseGroup>	colorComponentTypeGroup	(new tcu::TestCaseGroup(m_testCtx, "color_component_type_ext", "EGL_EXT_pixel_format_float tests"));

		colorComponentTypeGroup->addChild(new ColorComponentTypeCase(m_eglTestCtx, "dont_care",	EGL_DONT_CARE));
		colorComponentTypeGroup->addChild(new ColorComponentTypeCase(m_eglTestCtx, "fixed",		EGL_COLOR_COMPONENT_TYPE_FIXED_EXT));
		colorComponentTypeGroup->addChild(new ColorComponentTypeCase(m_eglTestCtx, "float",		EGL_COLOR_COMPONENT_TYPE_FLOAT_EXT));

		addChild(colorComponentTypeGroup.release());
	}
}